

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall helics::apps::Connector::runTo(Connector *this,Time stopTime_input)

{
  char cVar1;
  element_type *peVar2;
  
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  cVar1 = (char)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]
                [(long)&(peVar2->super_ValueFederate).vfManager._M_t];
  if (cVar1 == '\0') {
    (*(this->super_App)._vptr_App[2])(this);
  }
  else if ('\x01' < cVar1) {
    (*(((this->super_App).fed.
        super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ValueFederate)._vptr_ValueFederate[4])();
    return;
  }
  peVar2 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Federate::enterExecutingMode
            ((Federate *)
             ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),NO_ITERATIONS);
  return;
}

Assistant:

void Connector::runTo([[maybe_unused]] Time stopTime_input)
{
    auto cmode = fed->getCurrentMode();
    if (cmode == Federate::Modes::STARTUP) {
        initialize();
    }
    if (cmode < Federate::Modes::EXECUTING) {
        fed->enterExecutingMode();
    } else {
        fed->disconnect();
    }
}